

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O3

QString * Html::span(QString *__return_storage_ptr__,QString *text_,HtmlStyle *style)

{
  QString *pQVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QString text;
  QString local_c8;
  QString local_a8;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QString local_70;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  local_70.d.d = (text_->d).d;
  local_70.d.ptr = (text_->d).ptr;
  local_70.d.size = (text_->d).size;
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar2.m_data = (storage_type *)0x1;
  QVar2.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar2);
  local_a8.d.d = local_c8.d.d;
  local_a8.d.ptr = local_c8.d.ptr;
  local_a8.d.size = local_c8.d.size;
  QVar3.m_data = (storage_type *)0x4;
  QVar3.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar3);
  local_88 = &(local_c8.d.d)->super_QArrayData;
  pcStack_80 = local_c8.d.ptr;
  local_78 = local_c8.d.size;
  pQVar1 = (QString *)QString::replace(&local_70,&local_a8,(CaseSensitivity)&local_88);
  QVar4.m_data = (storage_type *)0x1;
  QVar4.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar4);
  local_58.d.d = local_c8.d.d;
  local_58.d.ptr = local_c8.d.ptr;
  local_58.d.size = local_c8.d.size;
  QVar5.m_data = (storage_type *)0x4;
  QVar5.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar5);
  local_38 = &(local_c8.d.d)->super_QArrayData;
  pcStack_30 = local_c8.d.ptr;
  local_28 = local_c8.d.size;
  QString::replace(pQVar1,&local_58,(CaseSensitivity)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x12;
  QVar6.m_size = (qsizetype)&local_c8;
  QString::fromUtf8(QVar6);
  local_88 = &(local_c8.d.d)->super_QArrayData;
  pcStack_80 = local_c8.d.ptr;
  local_78 = local_c8.d.size;
  HtmlStyle::toString(&local_c8,style);
  QString::arg(&local_a8,(int)&local_88,(QChar)(char16_t)&local_c8);
  QString::arg(__return_storage_ptr__,(int)&local_a8,(QChar)(char16_t)&local_70);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString Html::span(const QString &text_, const HtmlStyle& style) {
    QString text = text_;
    text.replace("<","&lt;").replace(">","&gt;");
    return QString("<span %1>%2</span>").arg(style.toString()).arg(text);
}